

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O1

void xmlDocDumpFormatMemoryEnc
               (xmlDocPtr out_doc,xmlChar **doc_txt_ptr,int *doc_txt_len,char *txt_encoding,
               int format)

{
  xmlOutputBufferPtr buf;
  size_t sVar1;
  xmlChar *pxVar2;
  
  if (doc_txt_len != (int *)0x0) {
    *doc_txt_len = 0;
  }
  if ((doc_txt_ptr != (xmlChar **)0x0) && (*doc_txt_ptr = (xmlChar *)0x0, out_doc != (xmlDocPtr)0x0)
     ) {
    buf = xmlAllocOutputBuffer((xmlCharEncodingHandlerPtr)0x0);
    if (buf != (xmlOutputBufferPtr)0x0) {
      xmlDocDumpInternal(buf,out_doc,txt_encoding,format);
      xmlOutputBufferFlush(buf);
      if (buf->error == 0) {
        if (doc_txt_len != (int *)0x0) {
          sVar1 = xmlBufUse(buf->buffer);
          *doc_txt_len = (int)sVar1;
        }
        pxVar2 = xmlBufDetach(buf->buffer);
        *doc_txt_ptr = pxVar2;
      }
      xmlOutputBufferClose(buf);
      return;
    }
    xmlRaiseMemoryError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,7,
                        (xmlError *)0x0);
    return;
  }
  return;
}

Assistant:

void
xmlDocDumpFormatMemoryEnc(xmlDocPtr out_doc, xmlChar **doc_txt_ptr,
		int * doc_txt_len, const char * txt_encoding,
		int format) {
    xmlOutputBufferPtr buf = NULL;

    if (doc_txt_len != NULL)
        *doc_txt_len = 0;

    if (doc_txt_ptr == NULL)
        return;
    *doc_txt_ptr = NULL;

    if (out_doc == NULL)
        return;

    buf = xmlAllocOutputBuffer(NULL);
    if (buf == NULL) {
        xmlSaveErrMemory(NULL);
        return;
    }

    xmlDocDumpInternal(buf, out_doc, txt_encoding, format);

    xmlOutputBufferFlush(buf);

    if (!buf->error) {
        if (doc_txt_len != NULL)
            *doc_txt_len = xmlBufUse(buf->buffer);
        *doc_txt_ptr = xmlBufDetach(buf->buffer);
    }

    xmlOutputBufferClose(buf);
}